

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

bool __thiscall
glcts::TextureCubeMapArraySamplingTest::verifyResultHelper
          (TextureCubeMapArraySamplingTest *this,formatDefinition *format,
          resolutionDefinition *resolution,componentProvider *component_provider,uchar *data)

{
  byte bVar1;
  uint n_mipmap_levels_00;
  uint n_layers_00;
  bool local_39;
  bool result;
  GLuint n_layers;
  GLuint n_mipmap_levels;
  uchar *data_local;
  componentProvider *component_provider_local;
  resolutionDefinition *resolution_local;
  formatDefinition *format_local;
  TextureCubeMapArraySamplingTest *this_local;
  
  bVar1 = getMipmapLevelCount(resolution->m_width,resolution->m_height);
  n_mipmap_levels_00 = (uint)bVar1;
  n_layers_00 = resolution->m_depth / 6;
  local_39 = false;
  if ((format->m_source).m_format == 0x1908) {
    if ((format->m_source).m_type == 0x1401) {
      local_39 = verifyResultImage<unsigned_char,4u,3u,3u>
                           (n_mipmap_levels_00,n_layers_00,
                            (_func_void_GLuint_GLint_GLint_GLint_GLint_uchar_ptr *)
                            component_provider->getColorUByteComponents,data);
    }
    else if ((format->m_source).m_type == 0x1406) {
      local_39 = verifyResultImage<float,4u,3u,3u>
                           (n_mipmap_levels_00,n_layers_00,
                            (_func_void_GLuint_GLint_GLint_GLint_GLint_float_ptr *)
                            component_provider->getColorFloatComponents,data);
    }
    else if ((format->m_source).m_type == 0x9278) {
      local_39 = verifyResultImage<unsigned_char,4u,3u,3u>
                           (n_mipmap_levels_00,n_layers_00,
                            (_func_void_GLuint_GLint_GLint_GLint_GLint_uchar_ptr *)
                            component_provider->getCompressedComponents,data);
    }
  }
  else if ((format->m_source).m_format == 0x8d99) {
    if ((format->m_source).m_type == 0x1405) {
      local_39 = verifyResultImage<unsigned_int,4u,3u,3u>
                           (n_mipmap_levels_00,n_layers_00,
                            (_func_void_GLuint_GLint_GLint_GLint_GLint_uint_ptr *)
                            component_provider->getColorUintComponents,data);
    }
    else if ((format->m_source).m_type == 0x1404) {
      local_39 = verifyResultImage<int,4u,3u,3u>
                           (n_mipmap_levels_00,n_layers_00,
                            (_func_void_GLuint_GLint_GLint_GLint_GLint_int_ptr *)
                            component_provider->getColorIntComponents,data);
    }
  }
  if (((format->m_source).m_format == 0x1902) && ((format->m_source).m_type == 0x1406)) {
    local_39 = verifyResultImage<float,1u,3u,3u>
                         (n_mipmap_levels_00,n_layers_00,
                          (_func_void_GLuint_GLint_GLint_GLint_GLint_float_ptr *)
                          component_provider->getDepthComponents,data);
  }
  if (((format->m_source).m_format == 0x1901) && ((format->m_source).m_type == 0x1401)) {
    local_39 = verifyResultImage<unsigned_int,1u,3u,3u>
                         (n_mipmap_levels_00,n_layers_00,
                          (_func_void_GLuint_GLint_GLint_GLint_GLint_uint_ptr *)
                          component_provider->getStencilComponents,data);
  }
  return local_39;
}

Assistant:

bool TextureCubeMapArraySamplingTest::verifyResultHelper(const formatDefinition&	 format,
														 const resolutionDefinition& resolution,
														 const componentProvider&	component_provider,
														 unsigned char*				 data)
{
	const glw::GLuint n_mipmap_levels = getMipmapLevelCount(resolution.m_width, resolution.m_height);
	const glw::GLuint n_layers		  = resolution.m_depth / 6;

	bool result = false;

	if (GL_RGBA == format.m_source.m_format)
	{
		if (GL_UNSIGNED_BYTE == format.m_source.m_type)
		{
			result = verifyResultImage<glw::GLubyte, 4, 3, 3>(n_mipmap_levels, n_layers,
															  component_provider.getColorUByteComponents, data);
		}
		else if (GL_FLOAT == format.m_source.m_type)
		{
			result = verifyResultImage<glw::GLfloat, 4, 3, 3>(n_mipmap_levels, n_layers,
															  component_provider.getColorFloatComponents, data);
		}
		else if (GL_COMPRESSED_RGBA8_ETC2_EAC == format.m_source.m_type)
		{
			result = verifyResultImage<glw::GLubyte, 4, 3, 3>(n_mipmap_levels, n_layers,
															  component_provider.getCompressedComponents, data);
		}
	}
	else if (GL_RGBA_INTEGER == format.m_source.m_format)
	{
		if (GL_UNSIGNED_INT == format.m_source.m_type)
		{
			result = verifyResultImage<glw::GLuint, 4, 3, 3>(n_mipmap_levels, n_layers,
															 component_provider.getColorUintComponents, data);
		}
		else if (GL_INT == format.m_source.m_type)
		{
			result = verifyResultImage<glw::GLint, 4, 3, 3>(n_mipmap_levels, n_layers,
															component_provider.getColorIntComponents, data);
		}
	}
	if (GL_DEPTH_COMPONENT == format.m_source.m_format)
	{
		if (GL_FLOAT == format.m_source.m_type)
		{
			result = verifyResultImage<glw::GLfloat, 1, 3, 3>(n_mipmap_levels, n_layers,
															  component_provider.getDepthComponents, data);
		}
	}
	if (GL_STENCIL_INDEX == format.m_source.m_format)
	{
		if (GL_UNSIGNED_BYTE == format.m_source.m_type)
		{
			result = verifyResultImage<glw::GLuint, 1, 3, 3>(n_mipmap_levels, n_layers,
															 component_provider.getStencilComponents, data);
		}
	}

	return result;
}